

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VL1Norm(N_Vector X,sunindextype param_2,sunindextype global_length,int myid)

{
  int iVar1;
  double dVar2;
  realtype rVar3;
  double dVar4;
  
  N_VConst(-1.0,X);
  dVar2 = get_time();
  rVar3 = N_VL1Norm(X);
  sync_device();
  dVar4 = get_time();
  if (0.0 <= rVar3) {
    if (ABS((rVar3 - (double)global_length) / (double)global_length) <= 1e-15) {
      iVar1 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VL1Norm ");
      }
      goto LAB_00104df6;
    }
  }
  printf(">>> FAILED test -- N_VL1Norm, Proc %d \n",(ulong)(uint)myid);
  iVar1 = 1;
LAB_00104df6:
  max_time(X,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VL1Norm");
  }
  return iVar1;
}

Assistant:

int Test_N_VL1Norm(N_Vector X, sunindextype local_length,
                   sunindextype global_length, int myid)
{
  int      fails = 0, failure = 0;
  double   start_time, stop_time, maxt;
  realtype ans;

  /* fill vector data */
  N_VConst(NEG_ONE, X);

  start_time = get_time();
  ans = N_VL1Norm(X);
  sync_device();
  stop_time = get_time();

  /* ans should equal global_length */
  failure = (ans < ZERO) ? 1 : FNEQ(ans, global_length);

  if (failure) {
    printf(">>> FAILED test -- N_VL1Norm, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VL1Norm \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VL1Norm", maxt);

  return(fails);
}